

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

void __thiscall gl4cts::ClipControlRenderBaseTest::deinit(ClipControlRenderBaseTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_ClipControlBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x440))(1,&(this->super_ClipControlBaseTest).field_0x7c);
  (**(code **)(lVar2 + 0x460))(1,&this->m_rboC);
  (**(code **)(lVar2 + 0x460))(1,&this->m_rboD);
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  return;
}

Assistant:

virtual void deinit(void)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		gl.deleteFramebuffers(1, &m_fbo);
		gl.deleteRenderbuffers(1, &m_rboC);
		gl.deleteRenderbuffers(1, &m_rboD);
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}